

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_0::EndianSwapTest(void)

{
  short expval;
  int expval_00;
  long expval_01;
  float fVar1;
  
  expval = EndianSwap<short>(0x1234);
  TestEq<short,int>(expval,0x3412,
                    "\'flatbuffers::EndianSwap(static_cast<int16_t>(0x1234))\' != \'0x3412\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x18d,"");
  expval_00 = EndianSwap<int>(0x12345678);
  TestEq<int,int>(expval_00,0x78563412,
                  "\'flatbuffers::EndianSwap(static_cast<int32_t>(0x12345678))\' != \'0x78563412\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,399,"");
  expval_01 = EndianSwap<long>(0x1234567890abcdef);
  TestEq<long,unsigned_long>
            (expval_01,0xefcdab9078563412,
             "\'flatbuffers::EndianSwap(static_cast<int64_t>(0x1234567890ABCDEF))\' != \'0xEFCDAB9078563412\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x191,"");
  fVar1 = EndianSwap<float>(3.14);
  fVar1 = EndianSwap<float>(fVar1);
  TestEq<float,float>(fVar1,3.14,
                      "\'flatbuffers::EndianSwap(flatbuffers::EndianSwap(3.14f))\' != \'3.14f\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                      ,0x192,"");
  return;
}

Assistant:

void EndianSwapTest() {
  TEST_EQ(flatbuffers::EndianSwap(static_cast<int16_t>(0x1234)), 0x3412);
  TEST_EQ(flatbuffers::EndianSwap(static_cast<int32_t>(0x12345678)),
          0x78563412);
  TEST_EQ(flatbuffers::EndianSwap(static_cast<int64_t>(0x1234567890ABCDEF)),
          0xEFCDAB9078563412);
  TEST_EQ(flatbuffers::EndianSwap(flatbuffers::EndianSwap(3.14f)), 3.14f);
}